

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall higan::LogFile::Append(LogFile *this,char *str,size_t len)

{
  bool bVar1;
  type mutex;
  MutexLockGuard local_28;
  MutexLockGuard guard;
  size_t len_local;
  char *str_local;
  LogFile *this_local;
  
  guard.mutex_ = (Mutex *)len;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (bVar1) {
    mutex = std::unique_ptr<higan::Mutex,_std::default_delete<higan::Mutex>_>::operator*
                      (&this->mutex_);
    MutexLockGuard::MutexLockGuard(&local_28,mutex);
    AppendInternal(this,str,(size_t)guard.mutex_);
    MutexLockGuard::~MutexLockGuard(&local_28);
  }
  else {
    AppendInternal(this,str,(size_t)guard.mutex_);
  }
  return;
}

Assistant:

void LogFile::Append(const char* str, size_t len)
{
	if (mutex_)
	{
		MutexLockGuard guard(*mutex_);
		AppendInternal(str, len);
	}
	else
	{
		AppendInternal(str, len);
	}
}